

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O3

double alex::fanout_tree::compute_level<int,int,alex::AlexCompare>
                 (double expected_insert_frac,long values,uint num_keys,long node,int total_keys,
                 vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 *used_fanout_tree_nodes,uint level,int max_data_node_keys,
                 bool approximate_model_computation,bool approximate_cost_computation)

{
  pointer *ppFVar1;
  V *values_00;
  iterator iVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  int *piVar8;
  int iVar9;
  int num_keys_00;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM7_Qb;
  LinearModel<int> model;
  DataNodeStats stats;
  FTNode local_c0;
  double local_78;
  LinearModel<int> local_68;
  ulong local_58;
  double local_50;
  DataNodeStats local_48;
  ulong uVar7;
  
  iVar5 = 1 << (level & 0x1f);
  dVar18 = (double)iVar5;
  if (level == 0x1f) {
    dVar19 = 0.0;
  }
  else {
    dVar3 = dVar18 * *(double *)(node + 0x10);
    dVar4 = dVar18 * *(double *)(node + 0x18);
    dVar19 = 0.0;
    local_58 = (ulong)(int)num_keys;
    iVar11 = 1;
    if (1 < iVar5) {
      iVar11 = iVar5;
    }
    iVar10 = 0;
    uVar14 = 0;
    local_50 = expected_insert_frac;
    do {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar4;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar3;
      uVar7 = (ulong)num_keys;
      if (iVar10 != iVar5 + -1) {
        lVar15 = values;
        if (0 < (int)num_keys) {
          uVar7 = local_58;
          do {
            uVar6 = uVar7 >> 1;
            if ((double)*(int *)(lVar15 + uVar6 * 8) < ((double)(iVar10 + 1) - dVar4) / dVar3) {
              lVar15 = lVar15 + 8 + uVar6 * 8;
              uVar6 = ~uVar6 + uVar7;
            }
            uVar7 = uVar6;
          } while (0 < (long)uVar6);
        }
        uVar6 = (ulong)(lVar15 - values) >> 3;
        uVar7 = uVar6;
        if ((int)uVar6 < (int)num_keys) {
          piVar8 = (int *)(values + (long)(int)uVar6 * 8);
          do {
            auVar17._0_8_ = (double)*piVar8;
            auVar17._8_8_ = in_XMM7_Qb;
            auVar17 = vfmadd213sd_fma(auVar17,auVar20,auVar21);
            uVar7 = uVar6;
            if (iVar10 < (int)auVar17._0_8_) break;
            uVar12 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar12;
            piVar8 = piVar8 + 2;
            uVar7 = (ulong)num_keys;
          } while (num_keys != uVar12);
        }
      }
      iVar13 = (int)uVar7;
      iVar9 = (int)uVar14;
      num_keys_00 = iVar13 - iVar9;
      if (num_keys_00 == 0) {
        local_c0.expected_avg_shifts._0_4_ = 0;
        local_c0.expected_avg_shifts._4_4_ = 0;
        local_c0.a._0_4_ = 0;
        local_c0.a._4_4_ = 0;
        local_c0.b._0_4_ = 0;
        local_c0.b._4_4_ = 0;
        local_c0.num_keys = 0;
        local_c0.cost = 0.0;
        local_c0._24_8_ = 0;
        local_c0.expected_avg_search_iterations._0_4_ = 0;
        local_c0.expected_avg_search_iterations._4_4_ = 0;
        local_c0.right_boundary = iVar9;
        local_c0.left_boundary = iVar9;
        iVar2._M_current =
             (used_fanout_tree_nodes->
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (used_fanout_tree_nodes->
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_c0.level = level;
          local_c0.node_id = iVar10;
          std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
          _M_realloc_insert<alex::fanout_tree::FTNode>(used_fanout_tree_nodes,iVar2,&local_c0);
        }
        else {
          *(ulong *)&(iVar2._M_current)->num_keys = (ulong)(uint)local_c0._68_4_ << 0x20;
          (iVar2._M_current)->level = level;
          (iVar2._M_current)->node_id = iVar10;
          (iVar2._M_current)->cost = 0.0;
          (iVar2._M_current)->left_boundary = iVar9;
          (iVar2._M_current)->right_boundary = iVar9;
          *(undefined8 *)&(iVar2._M_current)->use = 0;
          (iVar2._M_current)->expected_avg_search_iterations = 0.0;
          (iVar2._M_current)->expected_avg_shifts = 0.0;
          (iVar2._M_current)->a = 0.0;
          (iVar2._M_current)->b = 0.0;
          ppFVar1 = &(used_fanout_tree_nodes->
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
          local_c0.level = level;
          local_c0.node_id = iVar10;
        }
      }
      else {
        local_78 = (double)CONCAT44(local_78._4_4_,iVar9);
        values_00 = (V *)(values + (long)iVar9 * 8);
        local_68.a_ = 0.0;
        local_68.b_ = 0.0;
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
        build_model(values_00,num_keys_00,&local_68,approximate_model_computation);
        local_48.num_search_iterations = 0.0;
        local_48.num_shifts = 0.0;
        dVar16 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 ::compute_expected_cost
                           (values_00,num_keys_00,0.7,local_50,&local_68,
                            approximate_cost_computation,&local_48);
        local_c0.cost =
             (double)((ulong)(max_data_node_keys < num_keys_00) * (long)(dVar16 + 20.0) +
                     (ulong)(num_keys_00 <= max_data_node_keys) * (long)dVar16);
        local_c0.right_boundary = iVar13;
        local_c0.left_boundary = SUB84(local_78,0);
        local_c0._24_8_ = local_c0._24_8_ & 0xffffffffffffff00;
        local_c0.a._0_4_ = SUB84(local_68.a_,0);
        local_c0.a._4_4_ = (undefined4)((ulong)local_68.a_ >> 0x20);
        local_c0.b._0_4_ = SUB84(local_68.b_,0);
        local_c0.b._4_4_ = (undefined4)((ulong)local_68.b_ >> 0x20);
        local_c0.expected_avg_search_iterations._0_4_ = SUB84(local_48.num_search_iterations,0);
        local_c0.expected_avg_search_iterations._4_4_ =
             (undefined4)((ulong)local_48.num_search_iterations >> 0x20);
        local_c0.expected_avg_shifts._0_4_ = SUB84(local_48.num_shifts,0);
        local_c0.expected_avg_shifts._4_4_ = (undefined4)((ulong)local_48.num_shifts >> 0x20);
        iVar2._M_current =
             (used_fanout_tree_nodes->
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_c0.num_keys = num_keys_00;
        if (iVar2._M_current ==
            (used_fanout_tree_nodes->
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_c0.level = level;
          local_c0.node_id = iVar10;
          local_78 = local_c0.cost;
          std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
          _M_realloc_insert<alex::fanout_tree::FTNode>(used_fanout_tree_nodes,iVar2,&local_c0);
          dVar16 = local_78;
        }
        else {
          *(ulong *)&(iVar2._M_current)->num_keys = CONCAT44(local_c0._68_4_,num_keys_00);
          (iVar2._M_current)->level = level;
          (iVar2._M_current)->node_id = iVar10;
          (iVar2._M_current)->cost = local_c0.cost;
          (iVar2._M_current)->left_boundary = SUB84(local_78,0);
          (iVar2._M_current)->right_boundary = iVar13;
          (iVar2._M_current)->use = local_c0.use;
          *(undefined7 *)&(iVar2._M_current)->field_0x19 = local_c0._25_7_;
          (iVar2._M_current)->expected_avg_search_iterations = local_48.num_search_iterations;
          (iVar2._M_current)->expected_avg_shifts = local_48.num_shifts;
          (iVar2._M_current)->a = local_68.a_;
          (iVar2._M_current)->b = local_68.b_;
          ppFVar1 = &(used_fanout_tree_nodes->
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
          dVar16 = local_c0.cost;
          local_c0.level = level;
          local_c0.node_id = iVar10;
        }
        dVar19 = dVar19 + (dVar16 * (double)num_keys_00) / (double)(int)num_keys;
      }
      iVar10 = iVar10 + 1;
      uVar14 = uVar7;
    } while (iVar10 != iVar11);
  }
  return (dVar18 * 5e-07 * 208.0 * (double)total_keys) / (double)(int)num_keys + 20.0 + dVar19;
}

Assistant:

double compute_level(const std::pair<T, P> values[], int num_keys,
                     const AlexNode<T, P>* node, int total_keys,
                     std::vector<FTNode>& used_fanout_tree_nodes, int level,
                     int max_data_node_keys, double expected_insert_frac = 0,
                     bool approximate_model_computation = true,
                     bool approximate_cost_computation = false,
                     Compare key_less = Compare()) {
  int fanout = 1 << level;
  double cost = 0.0;
  double a = node->model_.a_ * fanout;
  double b = node->model_.b_ * fanout;
  int left_boundary = 0;
  int right_boundary = 0;
  for (int i = 0; i < fanout; i++) {
    left_boundary = right_boundary;
    right_boundary =
        i == fanout - 1
            ? num_keys
            : static_cast<int>(
                  std::lower_bound(values, values + num_keys, ((i + 1) - b) / a,
                                   [key_less](auto const& a, auto const& b) {
                                     return key_less(a.first, b);
                                   }) -
                  values);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < num_keys &&
           static_cast<int>(a * values[right_boundary].first + b) <= i) {
      right_boundary++;
    }
    if (left_boundary == right_boundary) {
      used_fanout_tree_nodes.push_back(
          {level, i, 0, left_boundary, right_boundary, false, 0, 0, 0, 0, 0});
      continue;
    }
    LinearModel<T> model;
    AlexDataNode<T, P>::build_model(values + left_boundary,
                                    right_boundary - left_boundary, &model,
                                    approximate_model_computation);

    DataNodeStats stats;
    double node_cost = AlexDataNode<T, P>::compute_expected_cost(
        values + left_boundary, right_boundary - left_boundary,
        AlexDataNode<T, P>::kInitDensity_, expected_insert_frac, &model,
        approximate_cost_computation, &stats);
    // If the node is too big to be a data node, proactively incorporate an
    // extra tree traversal level into the cost.
    if (right_boundary - left_boundary > max_data_node_keys) {
      node_cost += kNodeLookupsWeight;
    }

    cost += node_cost * (right_boundary - left_boundary) / num_keys;

    used_fanout_tree_nodes.push_back(
        {level, i, node_cost, left_boundary, right_boundary, false,
         stats.num_search_iterations, stats.num_shifts, model.a_, model.b_,
         right_boundary - left_boundary});
  }
  double traversal_cost =
      kNodeLookupsWeight +
      (kModelSizeWeight * fanout *
       (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
  cost += traversal_cost;
  return cost;
}